

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_value.c
# Opt level: O0

void assert_is_value(cJSON *value_item,int type)

{
  int type_local;
  cJSON *value_item_local;
  
  if (value_item == (cJSON *)0x0) {
    UnityFail("Item is NULL.",0x23);
  }
  if (value_item->next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x25);
  }
  if (value_item->prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x25);
  }
  UnityAssertBits(0xff,(long)type,(long)value_item->type,"Item doesn\'t have expected type.",0x26);
  UnityAssertBits(0x100,0,(long)value_item->type,"Item should not have a string as reference.",0x27)
  ;
  UnityAssertBits(0x200,0,(long)value_item->type,"Item should not have a const string.",0x28);
  if (value_item->string != (char *)0x0) {
    UnityFail("String is not NULL.",0x29);
  }
  return;
}

Assistant:

static void assert_is_value(cJSON *value_item, int type)
{
    TEST_ASSERT_NOT_NULL_MESSAGE(value_item, "Item is NULL.");

    assert_not_in_list(value_item);
    assert_has_type(value_item, type);
    assert_has_no_reference(value_item);
    assert_has_no_const_string(value_item);
    assert_has_no_string(value_item);
}